

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

Vec_Wec_t * Abc_GraphFrontiers(Vec_Int_t *vEdges,Vec_Int_t *vLife)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int Entry;
  Vec_Wec_t *p;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *p_01;
  ulong uVar5;
  long lVar6;
  int i;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  
  p = Vec_WecAlloc(vEdges->nSize / 2);
  p_00 = Vec_IntAlloc(vLife->nSize / 2);
  Vec_WecPushLevel(p);
  iVar10 = 0;
  do {
    if (vEdges->nSize / 2 <= iVar10) {
      Vec_IntFree(p_00);
      return p;
    }
    piVar4 = Vec_IntEntryP(vEdges,iVar10 * 2);
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      iVar3 = Vec_IntEntry(vLife,piVar4[lVar7] * 2);
      if (iVar3 == iVar10) {
        Vec_IntPush(p_00,piVar4[lVar7]);
      }
      else {
        iVar3 = Vec_IntEntry(vLife,piVar4[lVar7] * 2 + 1);
        if (iVar3 == iVar10) {
          uVar1 = p_00->nSize;
          uVar8 = 0;
          if (0 < (int)uVar1) {
            uVar8 = (ulong)uVar1;
          }
          lVar9 = 0;
          uVar5 = 0;
LAB_003d690c:
          if (uVar8 == uVar5) {
            if ((int)uVar1 < 0) {
              __assert_fail("i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
            }
          }
          else {
            piVar2 = p_00->pArray;
            if (piVar2[uVar5] != piVar4[lVar7]) goto code_r0x003d691b;
            for (lVar6 = 1; (int)uVar5 + (int)lVar6 < (int)uVar1; lVar6 = lVar6 + 1) {
              *(undefined4 *)((long)piVar2 + lVar6 * 4 + lVar9 + -4) =
                   *(undefined4 *)((long)piVar2 + lVar6 * 4 + lVar9);
            }
            p_00->nSize = uVar1 - 1;
          }
        }
      }
    }
    p_01 = Vec_WecPushLevel(p);
    i = 0;
    iVar3 = p_00->nSize;
    if (p_00->nSize < 1) {
      iVar3 = i;
    }
    for (; iVar3 != i; i = i + 1) {
      Entry = Vec_IntEntry(p_00,i);
      Vec_IntPush(p_01,Entry);
    }
    iVar10 = iVar10 + 1;
  } while( true );
code_r0x003d691b:
  uVar5 = uVar5 + 1;
  lVar9 = lVar9 + 4;
  goto LAB_003d690c;
}

Assistant:

Vec_Wec_t * Abc_GraphFrontiers( Vec_Int_t * vEdges, Vec_Int_t * vLife )
{
    Vec_Wec_t * vFronts = Vec_WecAlloc( Vec_IntSize(vEdges)/2 ); // front for each edge
    Vec_Int_t * vTemp = Vec_IntAlloc( Vec_IntSize(vLife)/2 );
    int e, n;    
    Vec_WecPushLevel(vFronts);
    for ( e = 0; e < Vec_IntSize(vEdges)/2; e++ )
    {
        int * pNodes = Vec_IntEntryP(vEdges, 2*e);
        for ( n = 0; n < 2; n++ )
            if ( Vec_IntEntry(vLife, 2*pNodes[n]) == e ) // first time
                Vec_IntPush( vTemp, pNodes[n] );
            else if ( Vec_IntEntry(vLife, 2*pNodes[n]+1) == e ) // last time
                Vec_IntRemove( vTemp, pNodes[n] );
        Vec_IntAppend( Vec_WecPushLevel(vFronts), vTemp );
    }
    //Vec_WecPrint( vFronts, 0 );
    Vec_IntFree( vTemp );
    return vFronts;
}